

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Array __thiscall pbrt::ScratchBuffer::Alloc<pbrt::Vertex[]>(ScratchBuffer *this,size_t n)

{
  Array pVVar1;
  Vertex *in_RSI;
  size_t i;
  ElementType *ret;
  ScratchBuffer *in_stack_00000028;
  Vertex *this_00;
  
  pVVar1 = (Array)Alloc(in_stack_00000028,(size_t)this,n);
  for (this_00 = (Vertex *)0x0; this_00 < in_RSI; this_00 = (Vertex *)((long)&this_00->type + 1)) {
    Vertex::Vertex(this_00);
  }
  return pVVar1;
}

Assistant:

PBRT_CPU_GPU typename AllocationTraits<T>::Array Alloc(size_t n = 1) {
        using ElementType = typename std::remove_extent<T>::type;
        ElementType *ret =
            (ElementType *)Alloc(n * sizeof(ElementType), alignof(ElementType));
        for (size_t i = 0; i < n; ++i)
            new (&ret[i]) ElementType();
        return ret;
    }